

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_SendToCommunicator
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  AInventory *pAVar2;
  char *pcVar3;
  int iVar4;
  FString msg;
  FSoundID local_50;
  FName local_4c;
  char name [32];
  
  iVar4 = 0;
  if ((it != (AActor *)0x0 && (arg1 == 0 || !backSide)) && (it->player != (player_t *)0x0)) {
    local_4c.Index = 0x113;
    pAVar2 = AActor::FindInventory(it,&local_4c);
    iVar4 = 0;
    if (pAVar2 != (AInventory *)0x0) {
      mysnprintf(name,0x20,"svox/voc%d",(ulong)(uint)arg0);
      if (arg3 == 0) {
        player_t::SetLogNumber(it->player,arg0);
      }
      bVar1 = AActor::CheckLocalView(it,consoleplayer);
      if (bVar1) {
        S_StopSound(2);
        local_50.ID = S_FindSound(name);
        S_Sound(2,&local_50,1.0,1.0);
        msg.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        FString::Format(&msg,"TXT_COMM%d",(ulong)(uint)arg2);
        pcVar3 = FStringTable::operator[](&GStrings,msg.Chars);
        if (pcVar3 != (char *)0x0) {
          Printf(3,"%s\n",pcVar3);
        }
        FString::~FString(&msg);
      }
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

FUNC(LS_SendToCommunicator)
// SendToCommunicator (voc #, front-only, identify, nolog)
{
	// This obviously isn't going to work for co-op.
	if (arg1 && backSide)
		return false;

	if (it != NULL && it->player != NULL && it->FindInventory(NAME_Communicator))
	{
		char name[32];									   
		mysnprintf (name, countof(name), "svox/voc%d", arg0);

		if (!arg3)
		{
			it->player->SetLogNumber (arg0);
		}

		if (it->CheckLocalView (consoleplayer))
		{
			S_StopSound (CHAN_VOICE);
			S_Sound (CHAN_VOICE, name, 1, ATTN_NORM);

			// Get the message from the LANGUAGE lump.
			FString msg;
			msg.Format("TXT_COMM%d", arg2);
			const char *str = GStrings[msg];
			if (str != NULL)
			{
				Printf (PRINT_CHAT, "%s\n", str);
			}
		}
		return true;
	}
	return false;
}